

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

int mraa_uart_lookup(char *uart_name)

{
  int iVar1;
  char *__s;
  mraa_board_t *pmVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  pmVar2 = plat;
  if (((uart_name != (char *)0x0 && plat != (mraa_board_t *)0x0) && (*uart_name != '\0')) &&
     (iVar1 = plat->uart_dev_count, 0 < (long)iVar1)) {
    lVar5 = 0;
    do {
      __s = *(char **)((long)&pmVar2->uart_dev[0].name + lVar5);
      if (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        iVar3 = strncmp(uart_name,__s,sVar4 + 1);
        if (iVar3 == 0) {
          return *(int *)((long)&pmVar2->uart_dev[0].index + lVar5);
        }
      }
      lVar5 = lVar5 + 0x28;
    } while ((long)iVar1 * 0x28 != lVar5);
  }
  return -1;
}

Assistant:

int
mraa_uart_lookup(const char* uart_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (uart_name == NULL || strlen(uart_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->uart_dev_count; i++) {
        if (plat->uart_dev[i].name != NULL &&
            strncmp(uart_name, plat->uart_dev[i].name, strlen(plat->uart_dev[i].name) + 1) == 0) {
            return plat->uart_dev[i].index;
        }
    }
    return -1;
}